

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O3

void __thiscall CDirectiveData::encodeNormal(CDirectiveData *this)

{
  vector<long,_std::allocator<long>_> *this_00;
  char cVar1;
  pointer plVar2;
  int32_t iVar3;
  pointer pEVar4;
  ulong uVar5;
  char *text;
  iterator iVar6;
  bool bVar7;
  ulong uVar8;
  int64_t num;
  ExpressionValue value;
  anon_union_8_2_b358304e_for_ExpressionValue_1 local_68;
  ExpressionValue local_60;
  
  plVar2 = (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar2) {
    (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar2;
  }
  this_00 = &this->normalData;
  pEVar4 = (this->entries).super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->entries).super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar4) {
    uVar5 = 0;
    do {
      Expression::evaluate(&local_60,pEVar4 + uVar5);
      text = "Invalid expression";
      if (local_60.type == Invalid) {
LAB_0018516d:
        Logger::queueError<>(Error,text);
      }
      else if (local_60.type == Integer) {
        local_68.intValue = local_60.field_1.intValue;
        iVar6._M_current =
             (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current !=
            (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00185160;
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)this_00,iVar6,&local_68.intValue);
      }
      else if (local_60.type == String) {
        if (local_60.strValue._value._M_string_length != 0) {
          uVar8 = 0;
          bVar7 = false;
          do {
            cVar1 = local_60.strValue._value._M_dataplus._M_p[uVar8];
            local_68 = (anon_union_8_2_b358304e_for_ExpressionValue_1)(long)cVar1;
            iVar6._M_current =
                 (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (this_00,iVar6,&local_68.intValue);
            }
            else {
              *iVar6._M_current = (long)local_68;
              (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar6._M_current + 1;
            }
            if (cVar1 < '\0' && !bVar7) {
              bVar7 = true;
              Logger::queueError<>
                        (Error,"Non-ASCII character in data directive. Use .string instead");
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < local_60.strValue._value._M_string_length);
        }
      }
      else if (this->mode == U32 && (local_60.type ^ Float) == Invalid) {
        iVar3 = getFloatBits((float)local_60.field_1.floatValue);
        local_68 = (anon_union_8_2_b358304e_for_ExpressionValue_1)(long)iVar3;
        iVar6._M_current =
             (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (this_00,iVar6,&local_68.intValue);
        }
        else {
LAB_00185160:
          *iVar6._M_current = (long)local_68;
          (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((anon_union_8_2_b358304e_for_ExpressionValue_1 *)iVar6._M_current + 1);
        }
      }
      else {
        text = "Invalid expression type";
        if ((local_60.type ^ Float) != Invalid || this->mode != U64) goto LAB_0018516d;
        local_68.intValue = getDoubleBits(local_60.field_1.floatValue);
        iVar6._M_current =
             (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current !=
            (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00185160;
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)this_00,iVar6,&local_68.intValue);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.strValue._value._M_dataplus._M_p != &local_60.strValue._value.field_2) {
        operator_delete(local_60.strValue._value._M_dataplus._M_p,
                        local_60.strValue._value.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
      pEVar4 = (this->entries).super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)(((long)(this->entries).
                                    super__Vector_base<Expression,_std::allocator<Expression>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 3) *
                            -0x5555555555555555));
  }
  if (this->writeTermination != false) {
    local_60.type = Invalid;
    local_60._4_4_ = 0;
    iVar6._M_current =
         (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (this_00,iVar6,(long *)&local_60);
    }
    else {
      *iVar6._M_current = 0;
      (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
  }
  return;
}

Assistant:

void CDirectiveData::encodeNormal()
{
	normalData.clear();
	for (size_t i = 0; i < entries.size(); i++)
	{
		ExpressionValue value = entries[i].evaluate();
		if (!value.isValid())
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			continue;
		}

		if (value.isString())
		{
			bool hadNonAscii = false;
			for (size_t l = 0; l < value.strValue.size(); l++)
			{
				uint64_t num = value.strValue.string()[l];
				normalData.push_back(num);

				if (num >= 0x80 && !hadNonAscii)
				{
					Logger::queueError(Logger::Error, "Non-ASCII character in data directive. Use .string instead");
					hadNonAscii = true;
				}
			}
		} else if (value.isInt())
		{
			int64_t num = value.intValue;
			normalData.push_back(num);
		} else if (value.isFloat() && mode == EncodingMode::U32)
		{
			int32_t num = getFloatBits((float)value.floatValue);
			normalData.push_back(num);
		} else if(value.isFloat() && mode == EncodingMode::U64) {
			int64_t num = getDoubleBits((double)value.floatValue);
			normalData.push_back(num);
		} else {
			Logger::queueError(Logger::Error, "Invalid expression type");
		}
	}

	if (writeTermination)
	{
		normalData.push_back(0);
	}
}